

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O1

string * __thiscall
tcu::StringTemplate::specialize
          (string *__return_storage_ptr__,StringTemplate *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  const_iterator cVar8;
  ulong uVar9;
  InternalError *pIVar10;
  long *plVar11;
  long *plVar12;
  char *__s;
  bool bVar13;
  bool bVar14;
  string flagsStr;
  string paramStr;
  string paramName;
  ostringstream res;
  undefined1 auStack_268 [8];
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  key_type local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string *local_1d8;
  _Base_ptr local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1d8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d0 = &(params->_M_t)._M_impl.super__Rb_tree_header._M_header;
  uVar9 = 0;
  local_200 = &params->_M_t;
  do {
    uVar4 = std::__cxx11::string::find((char *)this,0x23f2d0,uVar9);
    if (uVar4 == 0xffffffffffffffff) {
      if (uVar9 < (this->m_template)._M_string_length) {
        __s = (this->m_template)._M_dataplus._M_p + uVar9;
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xc0);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
        }
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_240,(ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      lVar5 = std::__cxx11::string::find((char *)this,0x22245c,uVar4);
      if (lVar5 == -1) {
        pIVar10 = (InternalError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  (pIVar10,"No \'}\' found in template parameter",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                   ,0x46);
        __cxa_throw(pIVar10,&InternalError::typeinfo,Exception::~Exception);
      }
      std::__cxx11::string::substr((ulong)&local_240,(ulong)this);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      lVar6 = std::__cxx11::string::find((char *)&local_240,0x24045c,0);
      if (lVar6 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_220);
        bVar13 = false;
        bVar14 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_260,(ulong)&local_240);
        std::__cxx11::string::operator=((string *)&local_220,(string *)&local_260);
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
        }
        std::__cxx11::string::substr((ulong)&local_260,(ulong)&local_240);
        iVar2 = std::__cxx11::string::compare((char *)&local_260);
        bVar13 = iVar2 == 0;
        if (!bVar13) {
          iVar3 = std::__cxx11::string::compare((char *)&local_260);
          if (iVar3 != 0) {
            pIVar10 = (InternalError *)__cxa_allocate_exception(0x38);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,"Unrecognized flag","");
            std::operator+(&local_1c8,&local_1f8,&local_240);
            InternalError::InternalError
                      (pIVar10,local_1c8._M_dataplus._M_p,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                       ,0x5c);
            __cxa_throw(pIVar10,&InternalError::typeinfo,Exception::~Exception);
          }
        }
        bVar14 = iVar2 != 0;
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
        }
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_200,&local_220);
      if (cVar8._M_node == local_1d0) {
        if (!bVar14) {
          pIVar10 = (InternalError *)__cxa_allocate_exception(0x38);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Value for parameter \'","");
          std::operator+(&local_1c8,&local_1f8,&local_220);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1c8);
          local_260 = (long *)*plVar11;
          plVar12 = plVar11 + 2;
          if (local_260 == plVar12) {
            local_250 = *plVar12;
            lStack_248 = plVar11[3];
            local_260 = &local_250;
          }
          else {
            local_250 = *plVar12;
          }
          local_258 = plVar11[1];
          *plVar11 = (long)plVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          InternalError::InternalError
                    (pIVar10,(char *)local_260,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                     ,0x71);
          __cxa_throw(pIVar10,&InternalError::typeinfo,Exception::~Exception);
        }
      }
      else {
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(local_200,&local_220);
        if (bVar13) {
          local_260 = &local_250;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,*(long *)(cVar8._M_node + 2),
                     (long)&(cVar8._M_node[2]._M_parent)->_M_color + *(long *)(cVar8._M_node + 2));
          while( true ) {
            uVar9 = std::__cxx11::string::find((char *)&local_260,0x2389cc,0);
            if (uVar9 == 0xffffffffffffffff) break;
            std::__cxx11::string::replace((ulong)&local_260,uVar9,(char *)0x1,0x23fb21);
            std::__cxx11::string::_M_assign((string *)&local_260);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_260,local_258);
          if (local_260 != &local_250) {
            operator_delete(local_260,local_250 + 1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,*(char **)(cVar8._M_node + 2),
                     (long)cVar8._M_node[2]._M_parent);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      uVar9 = lVar5 + 1;
    }
    psVar1 = local_1d8;
    if (uVar4 == 0xffffffffffffffff) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return psVar1;
    }
  } while( true );
}

Assistant:

string StringTemplate::specialize (const map<string, string>& params) const
{
	ostringstream res;

	size_t curNdx = 0;
	for (;;)
	{
		size_t paramNdx = m_template.find("${", curNdx);
		if (paramNdx != string::npos)
		{
			// Append in-between stuff.
			res << m_template.substr(curNdx, paramNdx - curNdx);

			// Find end-of-param.
			size_t paramEndNdx = m_template.find("}", paramNdx);
			if (paramEndNdx == string::npos)
				TCU_THROW(InternalError, "No '}' found in template parameter");

			// Parse parameter contents.
			string	paramStr		= m_template.substr(paramNdx+2, paramEndNdx-2-paramNdx);
			bool	paramSingleLine	= false;
			bool	paramOptional	= false;
			string	paramName;
			size_t colonNdx = paramStr.find(":");
			if (colonNdx != string::npos)
			{
				paramName = paramStr.substr(0, colonNdx);
				string flagsStr = paramStr.substr(colonNdx+1);
				if (flagsStr == "single-line")
				{
					paramSingleLine = true;
				}
				else if (flagsStr == "opt")
				{
					paramOptional = true;
				}
				else
				{
					TCU_THROW(InternalError, (string("Unrecognized flag") + paramStr).c_str());
				}
			}
			else
				paramName = paramStr;

			// Fill in parameter value.
			if (params.find(paramName) != params.end())
			{
				const string& val = (*params.find(paramName)).second;
				if (paramSingleLine)
				{
					string tmp = val;
					for (size_t ndx = tmp.find("\n"); ndx != string::npos; ndx = tmp.find("\n"))
						tmp = tmp.replace(ndx, 1, " ");
					res << tmp;
				}
				else
					res << val;
			}
			else if (!paramOptional)
				TCU_THROW(InternalError, (string("Value for parameter '") + paramName + "' not found in map").c_str());

			// Skip over template.
			curNdx = paramEndNdx + 1;
		}
		else
		{
			if (curNdx < m_template.length())
				res << &m_template[curNdx];

			break;
		}
	}

	return res.str();
}